

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

bool __thiscall
glcts::TextureCubeMapArraySamplingTest::verifyResult
          (TextureCubeMapArraySamplingTest *this,formatDefinition *format,
          resolutionDefinition *resolution,samplingFunction sampling_function,uchar *data)

{
  bool bVar1;
  componentProvider component_provider;
  componentProvider local_48;
  
  local_48.getDepthComponents = (_func_void_GLuint_GLint_GLint_GLint_GLint_GLfloat_ptr *)0x0;
  local_48.getStencilComponents = (_func_void_GLuint_GLint_GLint_GLint_GLint_GLuint_ptr *)0x0;
  local_48.getColorUintComponents = (_func_void_GLuint_GLint_GLint_GLint_GLint_GLuint_ptr *)0x0;
  local_48.getColorIntComponents = (_func_void_GLuint_GLint_GLint_GLint_GLint_GLint_ptr *)0x0;
  local_48.getColorFloatComponents = (_func_void_GLuint_GLint_GLint_GLint_GLint_GLfloat_ptr *)0x0;
  local_48.getColorUByteComponents = (_func_void_GLuint_GLint_GLint_GLint_GLint_GLubyte_ptr *)0x0;
  local_48.getCompressedComponents = (_func_void_GLuint_GLint_GLint_GLint_GLint_GLubyte_ptr *)0x0;
  if (sampling_function < 4) {
    local_48.getColorFloatComponents =
         (_func_void_GLuint_GLint_GLint_GLint_GLint_GLfloat_ptr *)
         (&PTR_getExpectedColorFloatComponentsForTexture_02114e20)[sampling_function];
    this = (TextureCubeMapArraySamplingTest *)
           (&PTR_getExpectedColorIntComponentsForTexture<unsigned_char>_02114e40)[sampling_function]
    ;
    local_48.getColorUintComponents =
         (_func_void_GLuint_GLint_GLint_GLint_GLint_GLuint_ptr *)
         (&PTR_getExpectedColorIntComponentsForTexture<unsigned_int>_02114e60)[sampling_function];
    local_48.getColorIntComponents =
         (_func_void_GLuint_GLint_GLint_GLint_GLint_GLint_ptr *)
         (&PTR_getExpectedColorIntComponentsForTexture<int>_02114e80)[sampling_function];
    local_48.getDepthComponents =
         (_func_void_GLuint_GLint_GLint_GLint_GLint_GLfloat_ptr *)
         (&PTR_getExpectedDepthComponentsForTexture_02114ea0)[sampling_function];
    local_48.getStencilComponents =
         (_func_void_GLuint_GLint_GLint_GLint_GLint_GLuint_ptr *)
         (&PTR_getExpectedStencilComponentsForTexture_02114ec0)[sampling_function];
    local_48.getCompressedComponents =
         (_func_void_GLuint_GLint_GLint_GLint_GLint_GLubyte_ptr *)
         (&PTR_getExpectedCompressedComponentsForTexture_02114ee0)[sampling_function];
    local_48.getColorUByteComponents = (_func_void_GLuint_GLint_GLint_GLint_GLint_GLubyte_ptr *)this
    ;
  }
  bVar1 = verifyResultHelper(this,format,resolution,&local_48,data);
  return bVar1;
}

Assistant:

bool TextureCubeMapArraySamplingTest::verifyResult(const formatDefinition&	 format,
												   const resolutionDefinition& resolution,
												   const samplingFunction sampling_function, unsigned char* data)
{
	componentProvider component_provider = { NULL, NULL, NULL, NULL, NULL, NULL, NULL };

	switch (sampling_function)
	{
	case Texture:
	case TextureGather:
		component_provider.getColorFloatComponents = getExpectedColorFloatComponentsForTexture;
		component_provider.getColorUByteComponents = getExpectedColorIntComponentsForTexture<glw::GLubyte>;
		component_provider.getColorUintComponents  = getExpectedColorIntComponentsForTexture<glw::GLuint>;
		component_provider.getColorIntComponents   = getExpectedColorIntComponentsForTexture<glw::GLint>;
		component_provider.getDepthComponents	  = getExpectedDepthComponentsForTexture;
		component_provider.getStencilComponents	= getExpectedStencilComponentsForTexture;
		component_provider.getCompressedComponents = getExpectedCompressedComponentsForTexture;
		break;
	case TextureLod:
	case TextureGrad:
		component_provider.getColorFloatComponents = getExpectedColorFloatComponentsForTextureLod;
		component_provider.getColorUByteComponents = getExpectedColorIntComponentsForTextureLod<glw::GLubyte>;
		component_provider.getColorUintComponents  = getExpectedColorIntComponentsForTextureLod<glw::GLuint>;
		component_provider.getColorIntComponents   = getExpectedColorIntComponentsForTextureLod<glw::GLint>;
		component_provider.getDepthComponents	  = getExpectedDepthComponentsForTextureLod;
		component_provider.getStencilComponents	= getExpectedStencilComponentsForTextureLod;
		component_provider.getCompressedComponents = getExpectedCompressedComponentsForTextureLod;
		break;
	}

	return verifyResultHelper(format, resolution, component_provider, data);
}